

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char * vrna_seq_ungapped(char *seq)

{
  char *pcVar1;
  char *p;
  int local_24;
  char *pcStack_20;
  int i;
  char *b;
  char *tmp_sequence;
  char *seq_local;
  
  b = (char *)0x0;
  if (seq != (char *)0x0) {
    p = strdup(seq);
    local_24 = 0;
    pcStack_20 = p;
    do {
      if ((((*pcStack_20 != '-') && (*pcStack_20 != '_')) && (*pcStack_20 != '~')) &&
         (*pcStack_20 != '.')) {
        p[local_24] = *pcStack_20;
        local_24 = local_24 + 1;
      }
      pcVar1 = pcStack_20 + 1;
      pcStack_20 = pcStack_20 + 1;
    } while (*pcVar1 != '\0');
    b = (char *)vrna_realloc(p,local_24 + 1);
    b[local_24] = '\0';
  }
  return b;
}

Assistant:

PUBLIC char *
vrna_seq_ungapped(const char *seq)
{
  char  *tmp_sequence, *b;
  int   i;

  tmp_sequence = NULL;

  if (seq) {
    tmp_sequence = strdup(seq);

    b = tmp_sequence;
    i = 0;
    do {
      if ((*b == '-') || (*b == '_') || (*b == '~') || (*b == '.'))
        continue;

      tmp_sequence[i] = *b;
      i++;
    } while (*(++b));

    tmp_sequence    = (char *)vrna_realloc(tmp_sequence, (i + 1) * sizeof(char));
    tmp_sequence[i] = '\0';
  }

  return tmp_sequence;
}